

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::ThreadData::thread_procedure
          (ThreadData *this,size_t i_target_put_count,size_t i_target_consume_count,
          uint64_t i_affinity_mask)

{
  EasyRandom *i_random;
  ulong uVar1;
  long lVar2;
  long lVar3;
  reentrant_put_transaction<void> *prVar4;
  reentrant_put_transaction<void> *prVar5;
  result_type_conflict rVar6;
  result_type rVar7;
  long lVar8;
  char cVar9;
  size_t cycles;
  reentrant_put_transaction<void> *this_00;
  ThreadAllocRandomFailures scoped_alloc_failures;
  ThreadAllocRandomFailures local_49;
  ulong local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  set_thread_affinity(i_affinity_mask);
  i_random = (EasyRandom *)(this + 0x50);
  ThreadAllocRandomFailures::ThreadAllocRandomFailures(&local_49,i_random,0.03);
  LOCK();
  *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 1;
  UNLOCK();
  cVar9 = '\0';
  local_48 = 0;
  do {
    uVar1 = *(ulong *)(this + 0x13e0);
    if (uVar1 < i_target_put_count) {
LAB_00d8102f:
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar7 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,&local_40._M_param);
      if (rVar7 < (ulong)((*(long *)(this + 0x13f8) - *(long *)(this + 0x13f0) >> 3) *
                         -0x3333333333333333)) {
        handle_pending_put(this,rVar7);
      }
    }
    else {
      if (i_target_consume_count <= *(ulong *)(this + 0x13e8)) {
        **(ulong **)(this + 0x48) = uVar1;
        *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
        lVar2 = *(long *)(this + 0x1408);
        lVar3 = *(long *)(this + 0x1410);
        lVar8 = lVar2;
        if (lVar3 != lVar2) {
          do {
            if (0xf < *(ulong *)(lVar8 + 0x10)) {
              LOCK();
              **(long **)(lVar8 + 8) = *(ulong *)(lVar8 + 0x10) - 2;
              UNLOCK();
              *(undefined8 *)(lVar8 + 0x10) = 0;
            }
            lVar8 = lVar8 + 0x20;
          } while (lVar8 != lVar3);
          *(long *)(this + 0x1410) = lVar2;
        }
        prVar4 = *(reentrant_put_transaction<void> **)(this + 0x13f0);
        prVar5 = *(reentrant_put_transaction<void> **)(this + 0x13f8);
        this_00 = prVar4;
        if (prVar5 != prVar4) {
          do {
            density::
            lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_put_transaction<void>::~reentrant_put_transaction(this_00);
            this_00 = this_00 + 0x28;
          } while (this_00 != prVar5);
          *(reentrant_put_transaction<void> **)(this + 0x13f8) = prVar4;
        }
        LOCK();
        *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 0;
        UNLOCK();
        ThreadAllocRandomFailures::~ThreadAllocRandomFailures(&local_49);
        return;
      }
      if (uVar1 < i_target_put_count) goto LAB_00d8102f;
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count) {
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar7 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,&local_40._M_param);
      if (rVar7 < (ulong)(*(long *)(this + 0x1410) - *(long *)(this + 0x1408) >> 5)) {
        handle_pending_consume(this,rVar7);
      }
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count &&
        (*(ulong *)(this + 0x13e0) < i_target_put_count && (local_48 & 1) == 0)) {
      local_40._M_param._M_a = 0x100000000;
      rVar6 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)i_random,(param_type *)&local_40);
      if (rVar6 == 0) goto LAB_00d81128;
LAB_00d8111e:
      try_consume_one(this);
    }
    else if (*(ulong *)(this + 0x13e0) < i_target_put_count && (local_48 & 1) == 0) {
LAB_00d81128:
      put_one(this);
    }
    else {
      if (*(ulong *)(this + 0x13e8) < i_target_consume_count) goto LAB_00d8111e;
      sched_yield();
    }
    if (cVar9 == '\0') {
      **(undefined8 **)(this + 0x48) = *(undefined8 *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      local_48 = CONCAT71((int7)((ulong)*(undefined1 **)(this + 0x1420) >> 8),
                          **(undefined1 **)(this + 0x1420));
    }
    cVar9 = cVar9 + '\x01';
  } while( true );
}

Assistant:

void thread_procedure(
              size_t const i_target_put_count,
              size_t const i_target_consume_count,
              uint64_t     i_affinity_mask)
            {
                set_thread_affinity(i_affinity_mask);

                ThreadAllocRandomFailures scoped_alloc_failures(m_random, 0.03);

                m_incremental_stats->m_thread_is_active.store(true);

                bool too_many_enqueued = false;

                for (size_t cycles = 0; m_put_committed < i_target_put_count ||
                                        m_consumes_committed < i_target_consume_count;
                     cycles++)
                {
                    // decide between put and consume

                    if (m_put_committed < i_target_put_count)
                    {
                        auto const pending_put_index = m_random.get_int<size_t>(15);
                        if (pending_put_index < m_pending_reentrant_puts.size())
                        {
                            handle_pending_put(pending_put_index);
                        }
                    }

                    if (m_consumes_committed < i_target_consume_count)
                    {
                        auto const pending_consume_index = m_random.get_int<size_t>(15);
                        if (pending_consume_index < m_pending_reentrant_consumes.size())
                        {
                            handle_pending_consume(pending_consume_index);
                        }
                    }

                    bool const can_produce =
                      m_put_committed < i_target_put_count && !too_many_enqueued;
                    bool const can_consume = m_consumes_committed < i_target_consume_count;

                    if (can_produce && can_consume)
                    {
                        if (m_random.get_bool())
                            put_one();
                        else
                            try_consume_one();
                    }
                    else if (can_produce)
                    {
                        put_one();
                    }
                    else if (can_consume)
                    {
                        try_consume_one();
                    }
                    else
                    {
                        std::this_thread::yield();
                    }

                    // update the progress periodically
                    if ((cycles & 255) == 0)
                    {
                        m_incremental_stats->m_produced.store(
                          m_put_committed, std::memory_order_relaxed);
                        m_incremental_stats->m_consumed.store(
                          m_consumes_committed, std::memory_order_relaxed);
                        too_many_enqueued =
                          m_feedback->m_too_many_enqueued.load(std::memory_order_relaxed);
                    }
                }

                m_incremental_stats->m_produced.store(m_put_committed, std::memory_order_relaxed);
                m_incremental_stats->m_consumed.store(
                  m_consumes_committed, std::memory_order_relaxed);

                /* we destroy the pending operation (they get canceled), because otherwise the
                    destructor of the queue would trigger an undefined behavior */
                m_pending_reentrant_consumes.clear();
                m_pending_reentrant_puts.clear();

                // to do: not exception safe
                m_incremental_stats->m_thread_is_active.store(false);
            }